

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O1

int Test_SUNSparseMatrixToCSR(SUNMatrix A)

{
  int iVar1;
  SUNMatrix *pp_Var2;
  uint uVar3;
  char *__s;
  SUNMatrix csr;
  SUNMatrix csc;
  SUNMatrix local_30;
  SUNMatrix local_28;
  
  iVar1 = SUNSparseMatrix_ToCSR(A,&local_30);
  if (iVar1 == 0) {
    pp_Var2 = &local_28;
    iVar1 = SUNSparseMatrix_ToCSC(local_30,pp_Var2);
    if (iVar1 == 0) {
      iVar1 = check_matrix(A,local_28,4.440892098500626e-14);
      if (iVar1 == 0) {
        puts("    PASSED test -- SUNSparseMatrixToCSR");
        SUNMatDestroy(local_30);
      }
      else {
        puts(">>> FAILED test --  Test_SUNSparseMatrixToCSR check_matrix failed");
        SUNMatDestroy(local_30);
      }
      uVar3 = (uint)(iVar1 != 0);
      goto LAB_00103ef4;
    }
    __s = ">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero";
  }
  else {
    __s = ">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero";
  }
  puts(__s);
  uVar3 = 1;
  pp_Var2 = &local_30;
LAB_00103ef4:
  SUNMatDestroy(*pp_Var2);
  return uVar3;
}

Assistant:

int Test_SUNSparseMatrixToCSR(SUNMatrix A)
{
  int failure;
  SUNMatrix csc, csr;
  sunrealtype tol = 200 * SUN_UNIT_ROUNDOFF;

  failure = SUNSparseMatrix_ToCSR(A, &csr);

  if (failure)
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero\n");
    SUNMatDestroy(csr);
    return (1);
  }

  /* check entries */
  if (SUNSparseMatrix_ToCSC(csr, &csc))
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero\n");
    SUNMatDestroy(csr);
    return (1);
  }

  if (check_matrix(A, csc, tol))
  {
    printf(
      ">>> FAILED test --  Test_SUNSparseMatrixToCSR check_matrix failed\n");
    SUNMatDestroy(csr);
    SUNMatDestroy(csc);
    return (1);
  }

  printf("    PASSED test -- SUNSparseMatrixToCSR\n");

  SUNMatDestroy(csr);
  SUNMatDestroy(csc);

  return (0);
}